

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

bool Js::DateImplementation::UtcTimeFromStrCore
               (char16 *psz,uint ulength,double *retVal,ScriptContext *scriptContext)

{
  size_t requestedBytes;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  TempArenaAllocatorObject *tempAllocator;
  WCHAR *str;
  CharClassifier *this;
  WCHAR WVar7;
  ulong uVar8;
  long lVar9;
  WCHAR *pWVar10;
  uint uVar11;
  WCHAR WVar12;
  codepoint_t ch;
  undefined *puVar13;
  int local_b8;
  int local_9c;
  ulong local_50;
  
  uVar8 = (ulong)ulength;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x3e1,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00b3d49b;
    *puVar6 = 0;
  }
  if (ulength < 0x7fffffff) {
    if (psz != (char16 *)0x0) {
      bVar2 = TryParseIsoString(psz,uVar8,retVal,scriptContext);
      if (bVar2) goto LAB_00b3d435;
      tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"UtcTimeFromStr");
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b3d49b;
        *puVar6 = 0;
      }
      requestedBytes = uVar8 * 2 + 2;
      str = (WCHAR *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(&(tempAllocator->allocator).
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   ,requestedBytes);
      if (str == (WCHAR *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00b3d49b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      js_memcpy_s(str,requestedBytes,psz,requestedBytes);
      _wcslwr_unsafe(str,uVar8 + 1);
      this = ScriptContext::GetCharClassifier(scriptContext);
      WVar7 = *str;
      if (WVar7 != L'\0') {
        __tls_get_addr(&PTR_01548f08);
        local_b8 = 0;
        local_9c = 0;
        local_50 = 0;
LAB_00b3c767:
        do {
          bVar2 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)WVar7);
          if (!bVar2) {
            WVar7 = *str;
            if (WVar7 == L'\0') break;
            pWVar10 = str + 1;
            if ((ushort)WVar7 < 0x21) {
switchD_00b3c7bb_caseD_2c:
LAB_00b3c81e:
              WVar7 = *pWVar10;
              str = pWVar10;
              goto joined_r0x00b3c85f;
            }
            uVar11 = (uint)(ushort)WVar7;
            switch(WVar7) {
            case L'(':
              WVar7 = *pWVar10;
              if (WVar7 != L'\0') {
                pWVar10 = str + 2;
                iVar4 = 1;
                do {
                  if (WVar7 == L')') {
                    iVar4 = iVar4 + -1;
                    if (iVar4 < 1) goto LAB_00b3c81e;
                  }
                  else if (WVar7 == L'(') {
                    iVar4 = iVar4 + 1;
                  }
                  WVar7 = *pWVar10;
                  pWVar10 = pWVar10 + 1;
                  if (WVar7 == L'\0') break;
                } while( true );
              }
              goto LAB_00b3d416;
            case L')':
            case L'*':
            case L'.':
              goto switchD_00b3c7bb_caseD_29;
            case L'+':
            case L'-':
              local_50 = (ulong)(uVar11 == 0x2b ^ 5);
              WVar7 = *pWVar10;
              str = pWVar10;
              goto joined_r0x00b3c85f;
            case L',':
            case L'/':
              goto switchD_00b3c7bb_caseD_2c;
            }
            if (uVar11 == 0x3a) goto switchD_00b3c7bb_caseD_2c;
switchD_00b3c7bb_caseD_29:
            if (0x7f < (ushort)WVar7) break;
            iVar4 = isalpha(uVar11);
            if (iVar4 == 0) {
              uVar11 = uVar11 - 0x30;
              if (uVar11 < 10) {
                lVar9 = 2;
                do {
                  WVar7 = *(WCHAR *)((long)str + lVar9);
                  if ((((uint)local_50 & 0xfffffffe) != 4) || (WVar7 != L':')) {
                    if (0x7f < (ushort)WVar7) goto LAB_00b3cc03;
                    if (9 < (ushort)WVar7 - 0x30) goto LAB_00b3cbe8;
                    if (0xc < lVar9) break;
                    uVar11 = ((uint)(ushort)WVar7 + uVar11 * 10) - 0x30;
                  }
                  lVar9 = lVar9 + 2;
                } while( true );
              }
              break;
            }
            ch = (codepoint_t)(ushort)*pWVar10;
            if ((ushort)*pWVar10 < 0x80) {
              do {
                iVar4 = isalpha(ch);
                if (((short)ch != 0x2e) && (iVar4 == 0)) break;
                ch = (codepoint_t)(ushort)pWVar10[1];
                pWVar10 = pWVar10 + 1;
              } while (ch < 0x80);
            }
            uVar8 = (long)pWVar10 - (long)str;
            WVar7 = str[(long)(uVar8 * 0x80000000 + -0x100000000) >> 0x20];
            WVar12 = (WCHAR)ch;
            while ((WVar12 != L'\0' &&
                   (((ushort)ch < 0x21 ||
                    (bVar2 = CharClassifier::IsBiDirectionalChar(this,ch), bVar2))))) {
              WVar12 = pWVar10[1];
              ch = (codepoint_t)(ushort)WVar12;
              pWVar10 = pWVar10 + 1;
            }
            iVar4 = (int)(uVar8 >> 1) - (uint)(WVar7 == L'.');
            if (iVar4 == 1) break;
            puVar13 = &ES5Array::vtable;
            while ((*(short *)(puVar13 + -8) < iVar4 ||
                   (iVar5 = bcmp(str,*(void **)(puVar13 + -0x10),(long)iVar4 * 2), iVar5 != 0))) {
              puVar13 = puVar13 + -0x10;
              if (puVar13 < (undefined *)0x14f41d1) goto LAB_00b3d416;
            }
            switch(*(undefined2 *)(puVar13 + -6)) {
            case 0:
              if (local_9c != 0) goto LAB_00b3d416;
              local_9c = *(int *)(puVar13 + -4);
              break;
            case 1:
              goto LAB_00b3d416;
            case 3:
              goto LAB_00b3d416;
            case 4:
              if (local_b8 != 0) goto LAB_00b3d416;
              local_b8 = *(int *)(puVar13 + -4);
            }
            WVar7 = *pWVar10;
            str = pWVar10;
            goto joined_r0x00b3d1fc;
          }
          WVar7 = str[1];
          str = str + 1;
joined_r0x00b3c85f:
        } while (WVar7 != L'\0');
      }
LAB_00b3d416:
      ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
    }
    *retVal = NAN;
  }
LAB_00b3d435:
  return ulength < 0x7fffffff;
LAB_00b3cbe8:
  if (WVar7 == L'\0') {
    str = (WCHAR *)((long)str + lVar9);
  }
  else {
LAB_00b3cc03:
    str = (WCHAR *)((long)str + lVar9);
    do {
      if ((0x20 < (ushort)WVar7) &&
         (bVar2 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)WVar7), !bVar2))
      goto LAB_00b3cc3a;
      WVar7 = str[1];
      str = str + 1;
    } while (WVar7 != L'\0');
  }
  WVar7 = L'\0';
LAB_00b3cc3a:
  switch((uint)local_50) {
  case 1:
    if (0x3b < (int)uVar11) goto LAB_00b3d416;
    local_50 = (ulong)((uint)(WVar7 == L':') * 2);
    str = (WCHAR *)((long)str + local_50);
    break;
  case 2:
    if (0x3b < (int)uVar11) goto LAB_00b3d416;
    str = str + (WVar7 == L'.');
    local_50 = (ulong)((uint)(WVar7 == L'.') * 3);
    break;
  case 3:
    if (((ulong)(lVar9 >> 1) < 2) || (lVar9 == 4)) {
      local_50 = 0;
    }
    else {
      local_50 = 0;
    }
    break;
  case 4:
  case 5:
    goto LAB_00b3d416;
  case 6:
    goto LAB_00b3d416;
  case 7:
    goto LAB_00b3d416;
  case 8:
    goto LAB_00b3d416;
  default:
    goto LAB_00b3d416;
  }
  WVar7 = *str;
joined_r0x00b3d1fc:
  if (WVar7 == L'\0') goto LAB_00b3d416;
  goto LAB_00b3c767;
}

Assistant:

bool DateImplementation::UtcTimeFromStrCore(
        __in_ecount_z(ulength) const char16 *psz,
        unsigned int ulength,
        double &retVal,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        if (ulength >= 0x7fffffff)
        {
            //Prevent unreasonable requests from causing overflows.
            return false;
        }

        if (nullptr == psz)
        {
            retVal = JavascriptNumber::NaN;
            return true;
        }

        // Try to parse the string as the ISO format first
        if(TryParseIsoString(psz, ulength, retVal, scriptContext))
        {
            return true;
        }

        enum
        {
            ssNil,
            ssMinutes,
            ssSeconds,
            ssMillisecond,
            ssAddOffset,
            ssSubOffset,
            ssDate,
            ssMonth,
            ssYear
        };

        char16 *pchBase;
        char16 *pch;
        char16 ch;
        char16 *pszSrc = nullptr;

        const int32 lwNil = 0x80000000;
        int32 cch;
        int32 depth;
        int32 lwT;
        int32 lwYear = lwNil;
        int32 lwMonth = lwNil;
        int32 lwDate = lwNil;
        int32 lwTime = lwNil;
        int32 lwMillisecond = lwNil;
        int32 lwZone = lwNil;
        int32 lwOffset = lwNil;

        int32 ss = ssNil;
        const SZS *pszs;

        bool fUtc;

        int tAmPm = 0;
        int tBcAd = 0;

        size_t numOfDigits = 0;
        double tv = JavascriptNumber::NaN; // Initialized for error handling.

        //Create a copy to analyze
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("UtcTimeFromStr"));

        pszSrc = AnewArray(tempAllocator, char16, ulength + 1);

        size_t size = sizeof(char16) * (ulength + 1);
        js_memcpy_s(pszSrc, size, psz, size);

        _wcslwr_s(pszSrc,ulength+1);
        bool isDateNegativeVersion5 = false;
        bool isNextFieldDateNegativeVersion5 = false;
        bool isZeroPaddedYear = false;
        const Js::CharClassifier *classifier = scriptContext->GetCharClassifier();
        #pragma prefast(suppress: __WARNING_INCORRECT_VALIDATION, "pch is guaranteed to be null terminated by __in_z on psz and js_memcpy_s copying the null byte")
        for (pch = pszSrc; 0 != (ch = classifier->SkipBiDirectionalChars(pch));)
        {
            pch++;
            if (ch <= ' ')
            {
                continue;
            }

            switch (ch)
            {
                case '(':
                {
                    // skip stuff in parens
                    for (depth = 1; 0 != (ch = *pch); )
                    {
                        pch++;
                        if (ch == '(')
                        {
                            depth++;
                        }
                        else if (ch == ')' && --depth <= 0)
                        {
                            break;
                        }
                    }
                    continue;
                }
                case ',':
                case ':':
                case '/':
                {
                    // ignore these
                    continue;
                }
                case '+':
                case '-':
                {
                    if (lwNil == lwTime)
                    {
                        goto LError;
                    }
                    ss = (ch == '+') ? ssAddOffset : ssSubOffset;
                    continue;
                }
            }


            pchBase = pch - 1;
            if (!FBig(ch) && isalpha(ch))
            {
                for ( ; !FBig(*pch) && (isalpha(*pch) || '.' == *pch); pch++)
                    ;

                cch = (int32)(pch - pchBase);

                if ('.' == pchBase[cch - 1])
                {
                    cch--;
                }
                //Assert(cch > 0);

                // skip to the next real character
                while (0 != (*pch) && (*pch <= ' ' || classifier->IsBiDirectionalChar(*pch)))
                {
                    pch++;
                }

                // have an alphabetic token - look it up
                if (cch == 1)
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    // military version of time zone
                    // z = GMT
                    // j isn't used
                    // a to m are 1 to 12
                    // n to y are -1 to -12
                    if (lwNil != lwZone)
                    {
                        goto LError;
                    }
                    if (ch <= 'm')
                    {
                        if (ch == 'j' || ch < 'a')
                        {
                            goto LError;
                        }
                        lwZone = (int32)(ch - 'a' + (ch < 'j')) * 60;
                    }
                    else if (ch <= 'y')
                    {
                        lwZone = -(int32)(ch - 'm') * 60;
                    }
                    else if (ch == 'z')
                    {
                        lwZone = 0;
                    }
                    else
                    {
                        goto LError;
                    }

                    // look for a time zone offset
                    ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                        ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                    continue;
                }

                // look for a token
                for (pszs = g_rgszs + kcszs; ; )
                {
                    if (pszs-- <= g_rgszs)
                        goto LError;
                    if (cch <= pszs->cch &&
                        0 == memcmp(pchBase, pszs->psz, cch * sizeof(char16)))
                    {
                        break;
                    }
                }

                switch (pszs->szst)
                {
                    case ParseStringTokenType::BcAd:
                    {
                        if (tBcAd != 0)
                        {
                            goto LError;
                        }
                        tBcAd = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::AmPm:
                    {
                        if (tAmPm != 0)
                        {
                            goto LError;
                        }
                        tAmPm = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::Month:
                    {
                        if (lwNil != lwMonth)
                        {
                            goto LError;
                        }
                        lwMonth = pszs->lwVal;
                        if ('-' == *pch)
                        {
                            // handle the case date is negative for "Thu, 23 Sep -0007 00:00:00 GMT"
                            isDateNegativeVersion5 = true;
                            pch++;
                        }
                        break;
                    }
                    case ParseStringTokenType::Zone:
                    {
                        if (lwNil != lwZone)
                        {
                            goto LError;
                        }
                        lwZone = pszs->lwVal;

                        // look for a time zone offset
                        ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                            ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                        break;
                    }
                }
                continue;
            }

            if (FBig(ch) || !isdigit(ch))
            {
                goto LError;
            }

            for (lwT = ch - '0'; ; pch++)
            {
                // for time zone offset HH:mm, we already got HH so skip ':' and grab mm
                if (((ss == ssAddOffset) || (ss == ssSubOffset)) && (*pch == ':')) 
                {
                    continue;
                }
                if (FBig(*pch) || !isdigit(*pch))
                {
                    break;
                }
                // to avoid overflow
                if (pch - pchBase > 6)
                {
                    goto LError;
                }
                // convert string to number, e.g. 07:30 -> 730
                lwT = lwT * 10 + *pch - '0';
            }

            numOfDigits = pch - pchBase;
            // skip to the next real character
            while (0 != (ch = *pch) && (ch <= ' ' || classifier->IsBiDirectionalChar(ch)))
            {
                pch++;
            }

            switch (ss)
            {
                case ssAddOffset:
                case ssSubOffset:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwOffset || lwNil == lwTime)
                        goto LError;
                    // convert into minutes, e.g. 730 -> 7*60+30
                    lwOffset = lwT < 24 ? lwT * 60 :
                        (lwT % 100) + (lwT / 100) * 60;
                    if (ssSubOffset == ss)
                        lwOffset = -lwOffset;
                    lwZone = 0; // An offset is always with respect to UTC
                    ss = ssNil;
                    break;
                }
                case ssMinutes:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT * 60;
                    ss = (ch == ':') ? (pch++, ssSeconds) : ssNil;
                    break;
                }
                case ssSeconds:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT;
                    ss = (ch == '.') ? (pch++, ssMillisecond) : ssNil;
                    break;
                }
                case ssMillisecond:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (numOfDigits <= 1)
                    {
                        // 1 digit only, treat it as hundreds
                        lwMillisecond = lwT * 100;
                    }
                    else if (numOfDigits <= 2)
                    {
                        // 2 digit only, treat it as tens
                        lwMillisecond = lwT * 10;
                    }
                    else if (numOfDigits <= 3)
                    {
                        // canonical 3 digit, per EcmaScript spec
                        lwMillisecond = lwT;
                    }
                    else
                    {
                        // ignore any digits beyond the third
                        lwMillisecond = (pchBase[0] - '0') * 100 + (pchBase[1] - '0') * 10 + (pchBase[2] - '0');
                    }

                    ss = ssNil;
                    break;
                }
                case ssDate:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwDate)
                        goto LError;
                    lwDate = lwT;

                    if ((lwNil == lwYear) && FDateDelimiter(ch))
                    {
                        // We have already parsed the year if the date is specified as YYYY/MM/DD,
                        // but not when it is specified as MM/DD/YYYY.
                        ss = ssYear;
                        pch++;
                    }
                    else
                    {
                        ss = ssNil;
                    }
                    break;
                }
                case ssMonth:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwMonth)
                    {
                        goto LError;
                    }

                    lwMonth = lwT - 1;

                    if (FDateDelimiter(ch))
                    {
                        // Mark the next token as the date so that it won't be confused with another token.
                        // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                        // the time offset without this.
                        ss = ssDate;
                        pch++;
                    }

                    break;
                }
                case ssYear:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwYear)
                        goto LError;

                    AssertMsg(isDateNegativeVersion5 == false, "lwYear should be positive as pre-version:5 parsing");
                    lwYear = lwT;
                    ss = ssNil;
                    if (lwT < 1000 && numOfDigits >= 4)
                    {
                        isZeroPaddedYear = true;
                    }
                    break;
                }
                default:
                {
                    // assumptions for getting a YEAR:
                    //    - an absolute value greater or equal than 70 (thus not hour!)
                    //    - wasn't preceded by negative sign for -version:5 year format
                    //    - lwT has at least 4 digits (e.g. 0017 is year 17 AD)
                    if (lwT >= 70 || isNextFieldDateNegativeVersion5 || numOfDigits >= 4)
                    {
                        // assume it's a year - this is used particularly as version:5 year parsing
                        if (lwNil != lwYear)
                            goto LError;

                        // handle the case date is negative for "Tue Feb 02 -2012 01:02:03 GMT-0800"
                        lwYear = isDateNegativeVersion5 ? -lwT : lwT;
                        isNextFieldDateNegativeVersion5 = false;

                        if (lwT < 1000 && numOfDigits >= 4)
                        {
                            isZeroPaddedYear = true;
                        }

                        if (FDateDelimiter(ch))
                        {
                            // Mark the next token as the month so that it won't be confused with another token.
                            // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                            // the time offset without this.
                            ss = ssMonth;
                            pch++;
                        }

                        break;
                    }

                    switch (ch)
                    {
                        case ':':
                        {
                            // hour
                            if (lwNil != lwTime)
                                goto LError;
                            if (lwT >= 24)
                                goto LError;
                            lwTime = lwT * 3600;
                            ss = ssMinutes;
                            pch++;
                            break;
                        }
                        case '/':
                        case '-':
                        {
                            // month
                            if (lwNil != lwMonth)
                            {
                                // can be year
                                if (lwNil != lwYear)
                                {
                                    // both were already parsed!
                                    goto LError;
                                }
                                else
                                {
                                    // this is a day - with the negative sign for the date (version 5+)
                                    lwDate = lwT;
                                    isDateNegativeVersion5 = true;

                                    // mark the next field to be year (version 5+)
                                    isNextFieldDateNegativeVersion5 = true;
                                }
                            }
                            else
                            {
                                // this is a month
                                lwMonth = lwT - 1;
                                ss = ssDate;
                            }
                            pch++;
                            break;
                        }
                        default:
                        {
                            // date
                            if (lwNil != lwDate)
                                goto LError;
                            lwDate = lwT;
                            break;
                        }
                    }
                    break;
                }
            }
            continue;
        }

        if (lwNil == lwYear ||
            lwNil == lwMonth || lwMonth > 11 ||
            lwNil == lwDate || lwDate > 31)
        {
            goto LError;
        }

        if (tBcAd != 0)
        {
            if (tBcAd < 0)
            {
                // BC. Note that 1 BC is year 0 and 2 BC is year -1.
                lwYear = -lwYear + 1;
            }
        }
        else if (lwYear < 50 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 2000;
        }
        else if (lwYear < 100 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 1900;
        }


        if (tAmPm != 0)
        {
            if (lwNil == lwTime)
            {
                goto LError;
            }
            if (lwTime >= 12 * 3600L && lwTime < 13 * 3600L)
            {
                // In the 12:00 hour. AM means subtract 12 hours and PM means
                // do nothing.
                if (tAmPm < 0)
                {
                    lwTime -= 12 * 3600L;
                }
            }
            else
            {
                // Not in the 12:00 hour. AM means do nothing and PM means
                // add 12 hours.
                if (tAmPm > 0)
                {
                    if (lwTime >= 12 * 3600L)
                    {
                        goto LError;
                    }
                    lwTime += 12 * 3600L;
                }
            }
        }
        else if (lwNil == lwTime)
        {
            lwTime = 0;
        }

        if (lwNil == lwMillisecond)
        {
            lwMillisecond = 0;
        }

        if (lwNil != lwZone)
        {
            lwTime -= lwZone * 60;
            fUtc = TRUE;
        }
        else
        {
            fUtc = FALSE;
        }
        if (lwNil != lwOffset)
        {
            lwTime -= lwOffset * 60;
        }

        // Rebuild time.
        tv = TvFromDate(lwYear, lwMonth, lwDate - 1, (double)lwTime * 1000 + lwMillisecond);
        if (!fUtc)
        {
            tv = GetTvUtc(tv, scriptContext);
        }

LError:
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        retVal = tv;
        return true;
    }